

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_enc_CharCodec.cpp
# Opt level: O0

size_t __thiscall
axl::enc::CharCodec::decode_utf8
          (CharCodec *this,String_utf8 *string,void *p0,size_t size,utf32_t replacement)

{
  size_t sVar1;
  long in_RCX;
  ulong in_RDX;
  long extraout_RDX;
  StringRefBase<char,_axl::sl::StringDetailsBase<char>_> *in_RSI;
  long *in_RDI;
  undefined4 in_R8D;
  size_t length;
  ConvertLengthResult result;
  utf8_t tmpBuffer [256];
  char *end;
  char *p;
  DecoderState state;
  undefined4 uVar2;
  undefined4 in_stack_fffffffffffffe8c;
  StringBase<char,_axl::sl::StringDetailsBase<char>_> *in_stack_fffffffffffffe90;
  undefined1 local_148 [264];
  ulong local_40;
  ulong local_38;
  undefined4 local_30;
  undefined4 local_2c;
  long local_28;
  ulong local_20;
  StringRefBase<char,_axl::sl::StringDetailsBase<char>_> *local_18;
  
  local_2c = in_R8D;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::clear(in_stack_fffffffffffffe90);
  local_30 = 0;
  local_38 = local_20;
  local_40 = local_20 + local_28;
  while ((local_38 < local_40 &&
         (uVar2 = local_2c,
         (**(code **)(*in_RDI + 0x88))
                   (in_RDI,&local_30,local_148,0x100,local_38,local_40 - local_38),
         extraout_RDX != 0))) {
    sVar1 = sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::append
                      (in_stack_fffffffffffffe90,(C *)CONCAT44(in_stack_fffffffffffffe8c,uVar2),
                       0x1880b4);
    if (sVar1 == 0xffffffffffffffff) {
      return 0xffffffffffffffff;
    }
    local_38 = extraout_RDX + local_38;
  }
  sVar1 = sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::getLength(local_18);
  return sVar1;
}

Assistant:

size_t
CharCodec::decode_utf8(
	sl::String_utf8* string,
	const void* p0,
	size_t size,
	utf32_t replacement
) {
	string->clear();

	DecoderState state = 0;
	const char* p = (const char*)p0;
	const char* end = p + size;
	while (p < end) {
		utf8_t tmpBuffer[256];
		ConvertLengthResult result = decode_utf8(
			&state,
			tmpBuffer,
			countof(tmpBuffer),
			p,
			end - p,
			replacement
		);

		if (!result.m_srcLength)
			break;

		size_t length = string->append(tmpBuffer, result.m_dstLength);
		if (length == -1)
			return -1;

		p += result.m_srcLength;
	}

	return string->getLength();
}